

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O0

QAccessibleInterface * __thiscall QAccessibleMenuItem::child(QAccessibleMenuItem *this,int index)

{
  QMenu *pQVar1;
  QObject *pQVar2;
  QAccessibleInterface *pQVar3;
  int in_ESI;
  QAccessibleMenuItem *in_RDI;
  
  if (in_ESI == 0) {
    action(in_RDI);
    pQVar1 = QAction::menu<QMenu*>((QAction *)0x7db724);
    if (pQVar1 != (QMenu *)0x0) {
      action(in_RDI);
      pQVar2 = (QObject *)QAction::menu<QMenu*>((QAction *)0x7db73c);
      pQVar3 = (QAccessibleInterface *)QAccessible::queryAccessibleInterface(pQVar2);
      return pQVar3;
    }
  }
  return (QAccessibleInterface *)0x0;
}

Assistant:

QAccessibleInterface *QAccessibleMenuItem::child(int index) const
{
    if (index == 0 && action()->menu())
        return QAccessible::queryAccessibleInterface(action()->menu());
    return nullptr;
}